

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O2

void __thiscall cmTarget::CheckProperty(cmTarget *this,string *prop,cmMakefile *context)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  ostream *poVar4;
  string local_220;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_200;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  ostringstream e;
  
  std::__cxx11::string::string((string *)&local_1c0,(string *)prop);
  bVar1 = cmHasLiteralPrefix<std::__cxx11::string,25ul>(&local_1c0,(char (*) [25])0x47a3c1);
  std::__cxx11::string::~string((string *)&local_1c0);
  if (bVar1) {
    pcVar3 = GetProperty(this,prop);
    if (pcVar3 != (char *)0x0) {
      cmTargetCheckLINK_INTERFACE_LIBRARIES(prop,pcVar3,context,false);
    }
  }
  std::__cxx11::string::string((string *)&local_1e0,(string *)prop);
  bVar1 = cmHasLiteralPrefix<std::__cxx11::string,34ul>
                    (&local_1e0,(char (*) [34])"IMPORTED_LINK_INTERFACE_LIBRARIES");
  std::__cxx11::string::~string((string *)&local_1e0);
  if (bVar1) {
    pcVar3 = GetProperty(this,prop);
    if (pcVar3 != (char *)0x0) {
      cmTargetCheckLINK_INTERFACE_LIBRARIES(prop,pcVar3,context,true);
    }
  }
  std::__cxx11::string::string((string *)&local_200,(string *)prop);
  bVar1 = cmHasLiteralPrefix<std::__cxx11::string,25ul>
                    (&local_200,(char (*) [25])"INTERFACE_LINK_LIBRARIES");
  std::__cxx11::string::~string((string *)&local_200);
  if (bVar1) {
    pcVar3 = GetProperty(this,prop);
    if (pcVar3 != (char *)0x0) {
      if (cmTargetCheckINTERFACE_LINK_LIBRARIES(char_const*,cmMakefile*)::keys == '\0') {
        iVar2 = __cxa_guard_acquire(&cmTargetCheckINTERFACE_LINK_LIBRARIES(char_const*,cmMakefile*)
                                     ::keys);
        if (iVar2 != 0) {
          cmsys::RegularExpression::RegularExpression
                    ((RegularExpression *)
                     cmTargetCheckINTERFACE_LINK_LIBRARIES(char_const*,cmMakefile*)::keys,
                     "(^|;)(debug|optimized|general)(;|$)");
          __cxa_atexit(cmsys::RegularExpression::~RegularExpression,
                       cmTargetCheckINTERFACE_LINK_LIBRARIES(char_const*,cmMakefile*)::keys,
                       &__dso_handle);
          __cxa_guard_release(&cmTargetCheckINTERFACE_LINK_LIBRARIES(char_const*,cmMakefile*)::keys)
          ;
        }
      }
      bVar1 = cmsys::RegularExpression::find
                        ((RegularExpression *)
                         cmTargetCheckINTERFACE_LINK_LIBRARIES(char_const*,cmMakefile*)::keys,pcVar3
                        );
      if (bVar1) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
        poVar4 = std::operator<<((ostream *)&e,
                                 "Property INTERFACE_LINK_LIBRARIES may not contain link-type keyword \""
                                );
        cmsys::RegularExpression::match_abi_cxx11_
                  (&local_220,
                   (RegularExpression *)
                   cmTargetCheckINTERFACE_LINK_LIBRARIES(char_const*,cmMakefile*)::keys,2);
        poVar4 = std::operator<<(poVar4,(string *)&local_220);
        std::operator<<(poVar4,
                        "\".  The INTERFACE_LINK_LIBRARIES property may contain configuration-sensitive generator-expressions which may be used to specify per-configuration rules."
                       );
        std::__cxx11::string::~string((string *)&local_220);
        std::__cxx11::stringbuf::str();
        cmMakefile::IssueMessage(context,FATAL_ERROR,&local_220);
        std::__cxx11::string::~string((string *)&local_220);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
      }
    }
  }
  return;
}

Assistant:

void cmTarget::CheckProperty(const std::string& prop,
                             cmMakefile* context) const
{
  // Certain properties need checking.
  if(cmHasLiteralPrefix(prop, "LINK_INTERFACE_LIBRARIES"))
    {
    if(const char* value = this->GetProperty(prop))
      {
      cmTargetCheckLINK_INTERFACE_LIBRARIES(prop, value, context, false);
      }
    }
  if(cmHasLiteralPrefix(prop, "IMPORTED_LINK_INTERFACE_LIBRARIES"))
    {
    if(const char* value = this->GetProperty(prop))
      {
      cmTargetCheckLINK_INTERFACE_LIBRARIES(prop, value, context, true);
      }
    }
  if(cmHasLiteralPrefix(prop, "INTERFACE_LINK_LIBRARIES"))
    {
    if(const char* value = this->GetProperty(prop))
      {
      cmTargetCheckINTERFACE_LINK_LIBRARIES(value, context);
      }
    }
}